

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::Node>::push_back
          (btAlignedObjectArray<btSoftBody::Node> *this,Node *_Val)

{
  int iVar1;
  long lVar2;
  int _Count;
  Node *pNVar3;
  byte bVar4;
  
  bVar4 = 0;
  iVar1 = this->m_size;
  if (iVar1 == this->m_capacity) {
    _Count = 1;
    if (iVar1 != 0) {
      _Count = iVar1 * 2;
    }
    reserve(this,_Count);
    iVar1 = this->m_size;
  }
  pNVar3 = this->m_data + iVar1;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pNVar3->super_Feature).super_Element.m_tag = (_Val->super_Feature).super_Element.m_tag;
    _Val = (Node *)((long)_Val + (ulong)bVar4 * -0x10 + 8);
    pNVar3 = (Node *)((long)pNVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}